

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O0

bool anon_unknown.dwarf_6cd17b::LoadCELLump(int lumpnum,CELPalette *palette,BYTE **pixels)

{
  bool bVar1;
  long lVar2;
  BYTE *pBVar3;
  ulong uVar4;
  BYTE *color;
  size_t i;
  undefined1 local_78 [8];
  CELHeader header;
  FWadLump lump;
  BYTE **pixels_local;
  CELPalette *palette_local;
  int lumpnum_local;
  
  FWadCollection::OpenLumpNum((FWadLump *)(header.reserved + 8),&Wads,lumpnum);
  bVar1 = LoadCELHeader((FileReader *)(header.reserved + 8),(CELHeader *)local_78);
  if (bVar1) {
    lVar2 = FWadLump::Read((FWadLump *)(header.reserved + 8),palette,0x300);
    if (lVar2 == 0x300) {
      for (color = (BYTE *)0x0; color < (BYTE *)0x100; color = color + 1) {
        pBVar3 = *palette + (long)color * 3;
        *pBVar3 = *pBVar3 << 2;
        pBVar3[1] = pBVar3[1] << 2;
        pBVar3[2] = pBVar3[2] << 2;
      }
      pBVar3 = (BYTE *)operator_new__((ulong)(uint)header._4_4_);
      *pixels = pBVar3;
      uVar4 = FWadLump::Read((FWadLump *)(header.reserved + 8),*pixels,(ulong)(uint)header._4_4_);
      if ((uint)header._4_4_ == uVar4) {
        palette_local._7_1_ = true;
      }
      else {
        if (*pixels != (BYTE *)0x0) {
          operator_delete__(*pixels);
        }
        palette_local._7_1_ = false;
      }
    }
    else {
      palette_local._7_1_ = false;
    }
  }
  else {
    palette_local._7_1_ = false;
  }
  FWadLump::~FWadLump((FWadLump *)(header.reserved + 8));
  return palette_local._7_1_;
}

Assistant:

bool LoadCELLump(const int lumpnum, CELPalette& palette, BYTE*& pixels)
	{
		FWadLump lump = Wads.OpenLumpNum(lumpnum);

		// Read header

		CELHeader header;

		if (!LoadCELHeader(lump, header))
		{
			return false;
		}

		// Read palette
		// and convert from its resolution from 0..63 to 0..255

		if (sizeof palette != lump.Read(&palette, sizeof palette))
		{
			return false;
		}

		for (size_t i = 0; i < 256; ++i)
		{
			BYTE* color = &palette[3 * i];
			color[0] *= 4;
			color[1] *= 4;
			color[2] *= 4;
		}

		// Read pixels

		pixels = new BYTE[header.size];

		if (header.size != lump.Read(pixels, header.size))
		{
			delete[] pixels;
			return false;
		}

		return true;
	}